

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median_filter.cc
# Opt level: O0

void __thiscall
sptk::MedianFilter::MedianFilter
          (MedianFilter *this,int num_input_order,int num_filter_order,
          InputSourceInterface *input_source,bool apply_each_dimension,bool use_magic_number,
          double magic_number)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  _func_int **in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  InputSourceInterface *in_RDI;
  byte in_R8B;
  byte in_R9B;
  _func_int **in_XMM0_Qa;
  int i;
  int future;
  MedianFilter *in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff78;
  InputSourceInterface *__new_size;
  undefined4 in_stack_ffffffffffffff80;
  int local_3c;
  
  InputSourceInterface::InputSourceInterface(in_RDI);
  in_RDI->_vptr_InputSourceInterface = (_func_int **)&PTR__MedianFilter_0012ac10;
  *(undefined4 *)&in_RDI[1]._vptr_InputSourceInterface = in_ESI;
  *(undefined4 *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) = in_EDX;
  in_RDI[2]._vptr_InputSourceInterface = in_RCX;
  *(byte *)&in_RDI[3]._vptr_InputSourceInterface = in_R8B & 1;
  *(byte *)((long)&in_RDI[3]._vptr_InputSourceInterface + 1) = in_R9B & 1;
  in_RDI[4]._vptr_InputSourceInterface = in_XMM0_Qa;
  *(undefined1 *)&in_RDI[5]._vptr_InputSourceInterface = 1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10709a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1070ad);
  std::
  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::deque((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *)0x1070c0);
  if ((((*(int *)&in_RDI[1]._vptr_InputSourceInterface < 0) ||
       (*(int *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) < 0)) ||
      (in_RDI[2]._vptr_InputSourceInterface == (_func_int **)0x0)) ||
     ((bVar1 = (**(code **)(*in_RCX + 0x18))(), (bVar1 & 1) == 0 ||
      (iVar3 = (**(code **)(*in_RCX + 0x10))(),
      iVar3 != *(int *)&in_RDI[1]._vptr_InputSourceInterface + 1)))) {
    *(undefined1 *)&in_RDI[5]._vptr_InputSourceInterface = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    __new_size = in_RDI + 9;
    if (((ulong)in_RDI[3]._vptr_InputSourceInterface & 1) == 0) {
      std::vector<double,_std::allocator<double>_>::size
                ((vector<double,_std::allocator<double>_> *)(in_RDI + 6));
    }
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,in_stack_ffffffffffffff80),
               (size_type)__new_size);
    iVar3 = *(int *)((long)&in_RDI[1]._vptr_InputSourceInterface + 4) / 2;
    *(int *)&in_RDI[0x16]._vptr_InputSourceInterface = iVar3;
    for (local_3c = 0; local_3c < iVar3; local_3c = local_3c + 1) {
      bVar2 = Forward(in_stack_ffffffffffffff58);
      if (!bVar2) {
        *(undefined1 *)&in_RDI[5]._vptr_InputSourceInterface = 0;
        return;
      }
    }
  }
  return;
}

Assistant:

MedianFilter::MedianFilter(int num_input_order, int num_filter_order,
                           InputSourceInterface* input_source,
                           bool apply_each_dimension, bool use_magic_number,
                           double magic_number)
    : num_input_order_(num_input_order),
      num_filter_order_(num_filter_order),
      input_source_(input_source),
      apply_each_dimension_(apply_each_dimension),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      is_valid_(true) {
  if (num_input_order_ < 0 || num_filter_order_ < 0 || NULL == input_source_ ||
      !input_source->IsValid() ||
      input_source->GetSize() != num_input_order_ + 1) {
    is_valid_ = false;
    return;
  }

  // Prepare memories.
  buffer_.resize(num_input_order_ + 1);
  flat_.resize(apply_each_dimension_
                   ? (num_filter_order_ + 1)
                   : (num_filter_order_ + 1) * buffer_.size());

  // Look ahead.
  const int future(num_filter_order_ / 2);
  count_down_ = future;
  for (int i(0); i < future; ++i) {
    if (!Forward()) {
      is_valid_ = false;
      return;
    }
  }
}